

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

int expr_donew(expr *expr,int ac,t_atom *av)

{
  int iVar1;
  _binbuf *x;
  ex_ex *peVar2;
  int local_5c;
  int i;
  _binbuf *b;
  char *pcStack_48;
  int exp_strlen;
  char *exp_string;
  long max_node;
  ex_ex *ret;
  ex_ex *list;
  t_atom *av_local;
  expr *peStack_18;
  int ac_local;
  expr *expr_local;
  
  exp_string = (char *)0x0;
  list = (ex_ex *)av;
  av_local._4_4_ = ac;
  peStack_18 = expr;
  memset(expr->exp_var,0,0x960);
  x = binbuf_new();
  binbuf_add(x,av_local._4_4_,(t_atom *)list);
  binbuf_gettext(x,&stack0xffffffffffffffb8,(int *)((long)&b + 4));
  binbuf_free(x);
  pcStack_48 = (char *)resizebytes(pcStack_48,(long)b._4_4_,(long)(b._4_4_ + 1));
  pcStack_48[b._4_4_] = '\0';
  peStack_18->exp_string = pcStack_48;
  peStack_18->exp_str = pcStack_48;
  peStack_18->exp_nexpr = 0;
  max_node = 0;
  while( true ) {
    if (*peStack_18->exp_str == '\0' && max_node != 0) {
      *(anon_union_8_5_735de1bb_for_ex_cont *)max_node = nullex.ex_cont;
      *(long *)(max_node + 8) = nullex.ex_type;
      *(ex_ex **)(max_node + 0x10) = nullex.ex_end;
      freebytes(pcStack_48,(long)(b._4_4_ + 1));
      return 0;
    }
    ret = ex_lex(peStack_18,(long *)&exp_string);
    if (ret == (ex_ex *)0x0) break;
    peVar2 = (ex_ex *)malloc((long)exp_string * 0x18);
    peStack_18->exp_stack[peStack_18->exp_nexpr] = peVar2;
    if (peStack_18->exp_stack[peStack_18->exp_nexpr] == (ex_ex *)0x0) {
      pd_error(peStack_18,"expr: malloc for expr nodes failed\n");
      break;
    }
    peStack_18->exp_stack[peStack_18->exp_nexpr][(long)(exp_string + -1)].ex_type = 0;
    peStack_18->exp_nexpr = peStack_18->exp_nexpr + 1;
    max_node = (long)ex_match(ret,0);
    if (100 < peStack_18->exp_nexpr) {
      pd_error(peStack_18,"expr: too many variables (maximum %d allowed)",100);
      break;
    }
    if ((((ex_ex *)max_node == (ex_ex *)0x0) ||
        (max_node = (long)ex_parse(peStack_18,ret,peStack_18->exp_stack[peStack_18->exp_nexpr + -1],
                                   (long *)0x0), (ex_ex *)max_node == (ex_ex *)0x0)) ||
       (iVar1 = ex_checklval(peStack_18->exp_stack[peStack_18->exp_nexpr + -1]), iVar1 != 0)) break;
    free(ret);
  }
  for (local_5c = 0; local_5c < peStack_18->exp_nexpr; local_5c = local_5c + 1) {
    free(peStack_18->exp_stack[local_5c]);
    peStack_18->exp_stack[local_5c] = (ex_ex *)0x0;
  }
  peStack_18->exp_nexpr = 0;
  if (ret != (ex_ex *)0x0) {
    free(ret);
  }
  freebytes(pcStack_48,(long)(b._4_4_ + 1));
  return 1;
}

Assistant:

int
expr_donew(struct expr *expr, int ac, t_atom *av)
{
        struct ex_ex *list;
        struct ex_ex *ret;
        long max_node = 0;              /* maximum number of nodes needed */
        char *exp_string;
        int exp_strlen;
        t_binbuf *b;
        int i;

        memset(expr->exp_var, 0, MAX_VARS * sizeof (*expr->exp_var));
#ifdef PD
        b = binbuf_new();
        binbuf_add(b, ac, av);
        binbuf_gettext(b, &exp_string, &exp_strlen);
        binbuf_free(b);
#else /* MSP */
 {
    char *buf = getbytes(0), *newbuf;
    int length = 0;
    char string[250];
    t_atom *ap;
    int indx;

    for (ap = av, indx = 0; indx < ac; indx++, ap = ++av) {
        int newlength;

        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
                length && buf[length-1] == ' ')
                        length--;
        atom_string(ap, string, 250);
        newlength = length + strlen(string) + 1;
        if (!(newbuf = t_resizebytes(buf, length, newlength)))
                                break;
        buf = newbuf;
        strcpy(buf + length, string);
        length = newlength;
        if (ap->a_type == A_SEMI)
                        buf[length-1] = '\n';
        else
                        buf[length-1] = ' ';
    }

    if (length && buf[length-1] == ' ') {
        if (newbuf = t_resizebytes(buf, length, length-1))
        {
            buf = newbuf;
            length--;
        }
    }
    exp_string = buf;
    exp_strlen  = length;
 }
#endif
        exp_string = (char *)t_resizebytes(exp_string, exp_strlen,exp_strlen+1);
        exp_string[exp_strlen] = 0;
        expr->exp_string = exp_string;
        expr->exp_str = exp_string;
        expr->exp_nexpr = 0;
        ret = (struct ex_ex *) 0;
        /*
         * if ret == 0 it means that we have no expression
         * so we let the pass go through to build a single null stack
         */
        while (*expr->exp_str || !ret) {
                list = ex_lex(expr, &max_node);
                if (!list) {            /* syntax error */
                        goto error;
                }
                expr->exp_stack[expr->exp_nexpr] =
                  (struct ex_ex *)fts_malloc(max_node * sizeof (struct ex_ex));
                                if (!expr->exp_stack[expr->exp_nexpr]) {
                                        post_error( (fts_object_t *) expr,
                                                "expr: malloc for expr nodes failed\n");
                                        goto error;
                                }
                                expr->exp_stack[expr->exp_nexpr][max_node-1].ex_type=0;
                expr->exp_nexpr++;
                ret = ex_match(list, (long)0);
                if (expr->exp_nexpr  > MAX_VARS)
                    /* we cannot exceed MAX_VARS '$' variables */
                {
                        post_error((fts_object_t *) expr,
                            "expr: too many variables (maximum %d allowed)",
                                MAX_VARS);
                        goto error;
                }
                if (!ret)               /* syntax error */
                        goto error;
                ret = ex_parse(expr,
                        list, expr->exp_stack[expr->exp_nexpr - 1], (long *)0);
                if (!ret || ex_checklval(expr->exp_stack[expr->exp_nexpr - 1]))
                        goto error;
                fts_free(list);
        }
        *ret = nullex;
        t_freebytes(exp_string, exp_strlen+1);
        return (0);
error:
        for (i = 0; i < expr->exp_nexpr; i++) {
                fts_free(expr->exp_stack[i]);
                expr->exp_stack[i] = 0;
        }
        expr->exp_nexpr = 0;
        if (list)
                fts_free(list);
        t_freebytes(exp_string, exp_strlen+1);
        return (1);
}